

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  shared_ptr<SimpleCyclic::Cyclic> simpleCyclic;
  undefined8 local_18;
  undefined8 local_10;
  
  SimpleCyclic::Cyclic::create();
  SimpleCyclic::Cyclic::doSomething(local_18);
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return 0;
}

Assistant:

int main()
{
    auto simpleCyclic = SimpleCyclic::Cyclic::create();
    simpleCyclic->doSomething();

    return 0;
}